

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_iso9660.c
# Opt level: O0

int heap_add_entry(archive_read *a,heap_queue *heap,file_info *file,uint64_t key)

{
  int iVar1;
  file_info **__dest;
  int local_54;
  int new_size;
  file_info **new_pending_files;
  int parent;
  int hole;
  uint64_t parent_key;
  uint64_t file_key;
  uint64_t key_local;
  file_info *file_local;
  heap_queue *heap_local;
  archive_read *a_local;
  
  if (heap->allocated <= heap->used) {
    local_54 = heap->allocated << 1;
    if (heap->allocated < 0x400) {
      local_54 = 0x400;
    }
    if (local_54 <= heap->allocated) {
      archive_set_error(&a->archive,0xc,"Out of memory");
      return -0x1e;
    }
    __dest = (file_info **)malloc((long)local_54 << 3);
    if (__dest == (file_info **)0x0) {
      archive_set_error(&a->archive,0xc,"Out of memory");
      return -0x1e;
    }
    if (heap->allocated != 0) {
      memcpy(__dest,heap->files,(long)heap->allocated << 3);
    }
    free(heap->files);
    heap->files = __dest;
    heap->allocated = local_54;
  }
  file->key = key;
  new_pending_files._4_4_ = heap->used;
  heap->used = new_pending_files._4_4_ + 1;
  while( true ) {
    if (new_pending_files._4_4_ < 1) {
      *heap->files = file;
      return 0;
    }
    iVar1 = (new_pending_files._4_4_ + -1) / 2;
    if (heap->files[iVar1]->key <= key) break;
    heap->files[new_pending_files._4_4_] = heap->files[iVar1];
    new_pending_files._4_4_ = iVar1;
  }
  heap->files[new_pending_files._4_4_] = file;
  return 0;
}

Assistant:

static int
heap_add_entry(struct archive_read *a, struct heap_queue *heap,
    struct file_info *file, uint64_t key)
{
	uint64_t file_key, parent_key;
	int hole, parent;

#ifndef __clang_analyzer__ /* It cannot see heap->files remains populated.  */
	/* Expand our pending files list as necessary. */
	if (heap->used >= heap->allocated) {
		struct file_info **new_pending_files;
		int new_size = heap->allocated * 2;

		if (heap->allocated < 1024)
			new_size = 1024;
		/* Overflow might keep us from growing the list. */
		if (new_size <= heap->allocated) {
			archive_set_error(&a->archive,
			    ENOMEM, "Out of memory");
			return (ARCHIVE_FATAL);
		}
		new_pending_files = (struct file_info **)
		    malloc(new_size * sizeof(new_pending_files[0]));
		if (new_pending_files == NULL) {
			archive_set_error(&a->archive,
			    ENOMEM, "Out of memory");
			return (ARCHIVE_FATAL);
		}
		if (heap->allocated)
			memcpy(new_pending_files, heap->files,
			    heap->allocated * sizeof(new_pending_files[0]));
		free(heap->files);
		heap->files = new_pending_files;
		heap->allocated = new_size;
	}
#endif

	file_key = file->key = key;

	/*
	 * Start with hole at end, walk it up tree to find insertion point.
	 */
	hole = heap->used++;
	while (hole > 0) {
		parent = (hole - 1)/2;
		parent_key = heap->files[parent]->key;
		if (file_key >= parent_key) {
			heap->files[hole] = file;
			return (ARCHIVE_OK);
		}
		/* Move parent into hole <==> move hole up tree. */
		heap->files[hole] = heap->files[parent];
		hole = parent;
	}
	heap->files[0] = file;

	return (ARCHIVE_OK);
}